

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int os_read_dir(osdirhdl_t hdl,char *buf,size_t buflen)

{
  dirent *pdVar1;
  char *in_RDX;
  size_t in_RSI;
  DIR *in_RDI;
  dirent *d;
  undefined4 local_4;
  
  pdVar1 = readdir(in_RDI);
  if (pdVar1 != (dirent *)0x0) {
    safe_strcpy((char *)in_RDI,in_RSI,in_RDX);
  }
  local_4 = (uint)(pdVar1 != (dirent *)0x0);
  return local_4;
}

Assistant:

int os_read_dir(osdirhdl_t hdl, char *buf, size_t buflen)
{
    // Read the next directory entry - if we've exhausted the search,
    // return failure.
    struct dirent *d = readdir(hdl);
    if (d == 0)
        return false;

    // return this entry
    safe_strcpy(buf, buflen, d->d_name);
    return true;
}